

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O2

int BZ2_bzBuffToBuffCompress
              (char *dest,uint *destLen,char *source,uint sourceLen,int blockSize100k,int verbosity,
              int workFactor)

{
  int iVar1;
  bz_stream local_78;
  
  iVar1 = -2;
  if (((((uint)workFactor < 0xfb) && ((uint)verbosity < 5)) && (dest != (char *)0x0)) &&
     (((destLen != (uint *)0x0 && (source != (char *)0x0)) && (0xfffffff6 < blockSize100k - 10U))))
  {
    iVar1 = 0x1e;
    if (workFactor != 0) {
      iVar1 = workFactor;
    }
    local_78.bzalloc = (_func_void_ptr_void_ptr_int_int *)0x0;
    local_78.bzfree = (_func_void_void_ptr_void_ptr *)0x0;
    local_78.opaque = (void *)0x0;
    iVar1 = BZ2_bzCompressInit(&local_78,blockSize100k,verbosity,iVar1);
    if (iVar1 == 0) {
      local_78.avail_out = *destLen;
      local_78.next_in = source;
      local_78.avail_in = sourceLen;
      local_78.next_out = dest;
      iVar1 = BZ2_bzCompress(&local_78,2);
      if (iVar1 == 3) {
        iVar1 = -8;
      }
      else if (iVar1 == 4) {
        *destLen = *destLen - local_78.avail_out;
        iVar1 = 0;
      }
      BZ2_bzCompressEnd(&local_78);
    }
  }
  return iVar1;
}

Assistant:

int BZ2_bzBuffToBuffCompress 
                         ( char*         dest, 
                           unsigned int* destLen,
                           char*         source, 
                           unsigned int  sourceLen,
                           int           blockSize100k, 
                           int           verbosity, 
                           int           workFactor )
{
   bz_stream strm;
   int ret;

   if (dest == NULL || destLen == NULL || 
       source == NULL ||
       blockSize100k < 1 || blockSize100k > 9 ||
       verbosity < 0 || verbosity > 4 ||
       workFactor < 0 || workFactor > 250) 
      return BZ_PARAM_ERROR;

   if (workFactor == 0) workFactor = 30;
   strm.bzalloc = NULL;
   strm.bzfree = NULL;
   strm.opaque = NULL;
   ret = BZ2_bzCompressInit ( &strm, blockSize100k, 
                              verbosity, workFactor );
   if (ret != BZ_OK) return ret;

   strm.next_in = source;
   strm.next_out = dest;
   strm.avail_in = sourceLen;
   strm.avail_out = *destLen;

   ret = BZ2_bzCompress ( &strm, BZ_FINISH );
   if (ret == BZ_FINISH_OK) goto output_overflow;
   if (ret != BZ_STREAM_END) goto errhandler;

   /* normal termination */
   *destLen -= strm.avail_out;   
   BZ2_bzCompressEnd ( &strm );
   return BZ_OK;

   output_overflow:
   BZ2_bzCompressEnd ( &strm );
   return BZ_OUTBUFF_FULL;

   errhandler:
   BZ2_bzCompressEnd ( &strm );
   return ret;
}